

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O1

void __thiscall FIX::Acceptor::initialize(Acceptor *this)

{
  SessionID *sessionID;
  SessionSettings *this_00;
  int iVar1;
  Dictionary *pDVar2;
  Session *pSVar3;
  mapped_type *ppSVar4;
  _Base_ptr p_Var5;
  ConfigError *pCVar6;
  SessionFactory factory;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  string local_f8;
  string local_d8;
  Sessions *local_b8;
  _Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
  *local_b0;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Rb_tree_node_base local_88;
  size_t local_68;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_60;
  
  this_00 = &this->m_settings;
  SessionSettings::getSessions
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             &local_60,this_00);
  if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"No sessions defined","");
    ConfigError::ConfigError(pCVar6,(string *)local_a8);
    __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  local_a8._0_8_ = this->m_application;
  local_a8._8_4_ = *(undefined4 *)&this->m_messageStoreFactory;
  local_a8._12_4_ = *(undefined4 *)((long)&this->m_messageStoreFactory + 4);
  local_98._M_allocated_capacity = (size_type)this->m_pLogFactory;
  local_88._M_left = &local_88;
  local_88._M_color = _S_red;
  local_88._M_parent = (_Base_ptr)0x0;
  local_68 = 0;
  local_88._M_right = local_88._M_left;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    local_b0 = (_Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
                *)&this->m_sessionIDs;
    local_b8 = &this->m_sessions;
    p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      sessionID = (SessionID *)(p_Var5 + 1);
      pDVar2 = SessionSettings::get(this_00,sessionID);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ConnectionType","");
      Dictionary::getString(&local_d8,pDVar2,&local_f8,false);
      iVar1 = std::__cxx11::string::compare((char *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (iVar1 == 0) {
        std::
        _Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
        ::_M_insert_unique<FIX::SessionID_const&>(local_b0,sessionID);
        pDVar2 = SessionSettings::get(this_00,sessionID);
        pSVar3 = SessionFactory::create((SessionFactory *)local_a8,sessionID,pDVar2);
        ppSVar4 = std::
                  map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
                  ::operator[](local_b8,sessionID);
        *ppSVar4 = pSVar3;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != &local_60._M_impl.super__Rb_tree_header);
  }
  if ((this->m_sessions)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    SessionFactory::~SessionFactory((SessionFactory *)local_a8);
    std::
    _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
    ::~_Rb_tree(&local_60);
    return;
  }
  pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"No sessions defined for acceptor","");
  ConfigError::ConfigError(pCVar6,&local_d8);
  __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

EXCEPT(ConfigError) {
  std::set<SessionID> sessions = m_settings.getSessions();
  std::set<SessionID>::iterator i;

  if (!sessions.size()) {
    throw ConfigError("No sessions defined");
  }

  SessionFactory factory(m_application, m_messageStoreFactory, m_pLogFactory);

  for (i = sessions.begin(); i != sessions.end(); ++i) {
    if (m_settings.get(*i).getString(CONNECTION_TYPE) == "acceptor") {
      m_sessionIDs.insert(*i);
      m_sessions[*i] = factory.create(*i, m_settings.get(*i));
    }
  }

  if (!m_sessions.size()) {
    throw ConfigError("No sessions defined for acceptor");
  }
}